

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  _Rb_tree_node_base *__k;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  ParseArgumentStatus PVar4;
  size_t sVar5;
  ostream *poVar6;
  iterator iVar7;
  long *plVar8;
  _Base_ptr extraout_RAX;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  LogMessage *pLVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  CommandLineInterface *pCVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  _Rb_tree_node_base *p_Var19;
  ParseArgumentStatus PVar20;
  char *pcVar21;
  CommandLineInterface *pCVar22;
  int iVar23;
  pointer directive;
  bool bVar24;
  string name;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  undefined1 local_100 [32];
  _Alloc_hider local_e0;
  char local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  CommandLineInterface *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  _Base_ptr local_78;
  _Rb_tree_node_base *local_70;
  _Base_ptr local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  string *local_58;
  _Base_ptr local_50 [4];
  
  pcVar21 = *argv;
  pcVar1 = (char *)(this->executable_name_)._M_string_length;
  strlen(pcVar21);
  pCVar22 = this;
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pcVar21);
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = this;
  if (1 < argc) {
    uVar18 = 1;
    do {
      pcVar21 = argv[uVar18];
      if (*pcVar21 == '@') {
        local_100._0_8_ = local_100 + 0x10;
        sVar5 = strlen(pcVar21 + 1);
        pCVar22 = (CommandLineInterface *)local_100;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,pcVar21 + 1,pcVar21 + sVar5 + 1);
        bVar2 = ExpandArgumentFile(pCVar22,(string *)local_100,&local_98);
        this = local_a0;
        pCVar22 = (CommandLineInterface *)local_100._0_8_;
        if ((CommandLineInterface *)local_100._0_8_ != (CommandLineInterface *)(local_100 + 0x10)) {
          operator_delete((void *)local_100._0_8_);
        }
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed to open argument file: ",0x1e);
          pcVar21 = argv[uVar18];
          sVar5 = strlen(pcVar21 + 1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,pcVar21 + 1,sVar5);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          PVar20 = PARSE_ARGUMENT_FAIL;
          goto LAB_00232e8e;
        }
      }
      else {
        std::__cxx11::string::string((string *)local_100,pcVar21,(allocator *)local_c0._M_local_buf)
        ;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
        pCVar22 = (CommandLineInterface *)local_100._0_8_;
        if ((CommandLineInterface *)local_100._0_8_ != (CommandLineInterface *)(local_100 + 0x10)) {
          operator_delete((void *)local_100._0_8_);
        }
      }
      uVar18 = uVar18 + 1;
    } while ((uint)argc != uVar18);
  }
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    PVar20 = PARSE_ARGUMENT_DONE_AND_EXIT;
    PrintHelpText(this);
    goto LAB_00232e8e;
  }
  bVar2 = local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    PVar20 = PARSE_ARGUMENT_FAIL;
  }
  else {
    PVar20 = PARSE_ARGUMENT_FAIL;
    uVar18 = 0;
    iVar23 = 0;
    do {
      local_100._0_8_ = local_100 + 0x10;
      local_100._8_8_ = (_Base_ptr)0x0;
      local_100._16_8_ = local_100._16_8_ & 0xffffffffffffff00;
      local_c0._M_allocated_capacity = (size_type)&local_b0;
      local_c0._8_8_ = 0;
      local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
      bVar3 = ParseArgument(pCVar22,local_98.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus.
                                    _M_p,(string *)local_100,(string *)&local_c0);
      if (bVar3) {
        iVar17 = iVar23 + 1;
        if (((long)local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5 != (long)iVar17) &&
           (*local_98.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar17]._M_dataplus._M_p != '-')) {
          std::__cxx11::string::_M_assign((string *)local_c0._M_local_buf);
          iVar23 = iVar17;
          goto LAB_002327bf;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Missing value for flag: ",0x18);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_100._0_8_,local_100._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        iVar17 = std::__cxx11::string::compare((char *)local_100);
        if (iVar17 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"To decode an unknown message, use --decode_raw.",0x2f);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
        }
        bVar3 = false;
        PVar20 = PARSE_ARGUMENT_FAIL;
      }
      else {
LAB_002327bf:
        PVar4 = InterpretArgument(local_a0,(string *)local_100,(string *)&local_c0);
        bVar3 = PVar4 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
        if (!bVar3) {
          PVar20 = PVar4;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_allocated_capacity != &local_b0) {
        operator_delete((void *)local_c0._M_allocated_capacity);
      }
      pCVar22 = (CommandLineInterface *)local_100._0_8_;
      if ((CommandLineInterface *)local_100._0_8_ != (CommandLineInterface *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_);
      }
      if (!bVar3) break;
      iVar23 = iVar23 + 1;
      uVar18 = (ulong)iVar23;
      uVar15 = (long)local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      bVar2 = uVar18 < uVar15;
    } while (uVar18 < uVar15);
  }
  if (bVar2) goto LAB_00232e8e;
  p_Var10 = (local_a0->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var19 = &(local_a0->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header;
  pCVar22 = local_a0;
  if (p_Var10 != p_Var19) {
    local_60 = &local_a0->plugins_;
    local_68 = &(local_a0->plugins_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_58 = &local_a0->plugin_prefix_;
    local_78 = (_Base_ptr)0x0;
    local_70 = p_Var19;
    do {
      __k = p_Var10 + 1;
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_60->_M_t,(key_type *)__k);
      if (iVar7._M_node == local_68) {
        directive = (pCVar22->output_directives_).
                    super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if (directive !=
            (pCVar22->output_directives_).
            super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar3 = false;
          bVar2 = false;
          do {
            if (directive->generator == (CodeGenerator *)0x0) {
              anon_unknown_4::PluginName((string *)local_100,local_58,&directive->name);
              if ((_Base_ptr)local_100._8_8_ == p_Var10[1]._M_parent) {
                if ((_Base_ptr)local_100._8_8_ == (_Base_ptr)0x0) {
                  bVar24 = true;
                }
                else {
                  iVar23 = bcmp((void *)local_100._0_8_,*(void **)__k,local_100._8_8_);
                  bVar24 = iVar23 == 0;
                }
              }
              else {
                bVar24 = false;
              }
              bVar2 = bVar3;
              if (bVar24) {
                bVar2 = true;
              }
              if ((CommandLineInterface *)local_100._0_8_ !=
                  (CommandLineInterface *)(local_100 + 0x10)) {
                operator_delete((void *)local_100._0_8_);
              }
              pCVar22 = local_a0;
              bVar3 = bVar2;
              if (bVar24) break;
            }
            directive = directive + 1;
          } while (directive !=
                   (pCVar22->output_directives_).
                   super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          p_Var19 = local_70;
          if (bVar2) goto LAB_00232b17;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown flag: ",0xe);
        std::__cxx11::string::substr((ulong)local_50,(ulong)__k);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3e2ae7);
        local_c0._M_allocated_capacity = (size_type)&local_b0;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 == paVar12) {
          local_b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_b0._8_8_ = plVar8[3];
        }
        else {
          local_b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_c0._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
        }
        local_c0._8_8_ = plVar8[1];
        *plVar8 = (long)paVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append(local_c0._M_local_buf);
        local_100._0_8_ = local_100 + 0x10;
        pCVar13 = (CommandLineInterface *)(plVar8 + 2);
        if ((CommandLineInterface *)*plVar8 == pCVar13) {
          local_100._16_8_ = (pCVar13->executable_name_)._M_dataplus._M_p;
          local_100._24_8_ = plVar8[3];
        }
        else {
          local_100._16_8_ = (pCVar13->executable_name_)._M_dataplus._M_p;
          local_100._0_8_ = (CommandLineInterface *)*plVar8;
        }
        local_100._8_8_ = plVar8[1];
        *plVar8 = (long)pCVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_100._0_8_,local_100._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((CommandLineInterface *)local_100._0_8_ != (CommandLineInterface *)(local_100 + 0x10)) {
          operator_delete((void *)local_100._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_allocated_capacity != &local_b0) {
          operator_delete((void *)local_c0._M_allocated_capacity);
        }
        p_Var9 = (_Base_ptr)(local_50 + 2);
        if (local_50[0] != p_Var9) {
          operator_delete(local_50[0]);
          p_Var9 = extraout_RAX;
        }
        local_78 = (_Base_ptr)CONCAT71((int7)((ulong)p_Var9 >> 8),1);
      }
LAB_00232b17:
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var19);
    PVar20 = PARSE_ARGUMENT_FAIL;
    if (((ulong)local_78 & 1) != 0) goto LAB_00232e8e;
  }
  if (((pCVar22->proto_path_).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (pCVar22->proto_path_).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((pCVar22->descriptor_set_in_names_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pCVar22->descriptor_set_in_names_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_100,(char (*) [1])0x3e25d9,(char (*) [2])0x43fec6);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&pCVar22->proto_path_,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_100);
    if (local_e0._M_p != local_d0) {
      operator_delete(local_e0._M_p);
    }
    if ((CommandLineInterface *)local_100._0_8_ != (CommandLineInterface *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
  }
  switch(pCVar22->mode_) {
  case MODE_COMPILE:
    lVar16 = 0x180;
    lVar14 = 0x178;
LAB_00232c76:
    if (*(long *)((long)&(pCVar22->executable_name_)._M_dataplus._M_p + lVar14) !=
        *(long *)((long)&(pCVar22->executable_name_)._M_dataplus._M_p + lVar16)) break;
    lVar16 = 0x13;
    pcVar21 = "Missing input file.";
    goto LAB_00232d07;
  case MODE_ENCODE:
  case MODE_PRINT:
switchD_00232bcc_caseD_1:
    if ((pCVar22->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar22->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar16 = 0x228;
      lVar14 = 0x220;
      goto LAB_00232c76;
    }
    break;
  case MODE_DECODE:
    if ((pCVar22->codec_type_)._M_string_length != 0) goto switchD_00232bcc_caseD_1;
    lVar16 = 0x38;
    pcVar21 = "When using --decode_raw, no input files should be given.";
    if (((pCVar22->input_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (pCVar22->input_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((pCVar22->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar22->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) break;
    goto LAB_00232e71;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x613);
    pLVar11 = internal::LogMessage::operator<<((LogMessage *)local_100,"Unexpected mode: ");
    pLVar11 = internal::LogMessage::operator<<(pLVar11,pCVar22->mode_);
    internal::LogFinisher::operator=((LogFinisher *)local_c0._M_local_buf,pLVar11);
    internal::LogMessage::~LogMessage((LogMessage *)local_100);
  }
  if (pCVar22->mode_ == MODE_COMPILE) {
    if (((pCVar22->output_directives_).
         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pCVar22->output_directives_).
         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((pCVar22->descriptor_set_out_name_)._M_string_length != 0)) goto LAB_00232d7e;
    lVar16 = 0x1a;
    pcVar21 = "Missing output directives.";
  }
  else {
    if ((pCVar22->dependency_out_name_)._M_string_length != 0) {
      lVar16 = 0x38;
      pcVar21 = "Can only use --dependency_out=FILE when generating code.";
LAB_00232d07:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar21,lVar16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      PVar20 = PARSE_ARGUMENT_FAIL;
      goto LAB_00232e8e;
    }
LAB_00232d7e:
    if ((pCVar22->mode_ == MODE_ENCODE) || (pCVar22->deterministic_output_ == false)) {
      if (((pCVar22->dependency_out_name_)._M_string_length == 0) ||
         ((ulong)((long)(pCVar22->input_files_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pCVar22->input_files_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21)) {
        if ((pCVar22->imports_in_descriptor_set_ == true) &&
           ((pCVar22->descriptor_set_out_name_)._M_string_length == 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "--include_imports only makes sense when combined with --descriptor_set_out.",
                     0x4b);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        }
        PVar20 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
        if ((pCVar22->source_info_in_descriptor_set_ == true) &&
           ((pCVar22->descriptor_set_out_name_)._M_string_length == 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "--include_source_info only makes sense when combined with --descriptor_set_out."
                     ,0x4f);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          PVar20 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        goto LAB_00232e8e;
      }
      lVar16 = 0x41;
      pcVar21 = "Can only process one input file when using --dependency_out=FILE.";
    }
    else {
      lVar16 = 0x32;
      pcVar21 = "Can only use --deterministic_output with --encode.";
    }
  }
LAB_00232e71:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar21,lVar16);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  PVar20 = PARSE_ARGUMENT_FAIL;
LAB_00232e8e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return PVar20;
}

Assistant:

CommandLineInterface::ParseArgumentStatus CommandLineInterface::ParseArguments(
    int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<std::string> arguments;
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '@') {
      if (!ExpandArgumentFile(argv[i] + 1, &arguments)) {
        std::cerr << "Failed to open argument file: " << (argv[i] + 1)
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
      continue;
    }
    arguments.push_back(argv[i]);
  }

  // if no arguments are given, show help
  if (arguments.empty()) {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.
  }

  // Iterate through all arguments and parse them.
  for (int i = 0; i < arguments.size(); ++i) {
    std::string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE) return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (std::map<std::string, std::string>::const_iterator i =
           plugin_parameters_.begin();
       i != plugin_parameters_.end(); ++i) {
    if (plugins_.find(i->first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (std::vector<OutputDirective>::const_iterator j =
             output_directives_.begin();
         j != output_directives_.end(); ++j) {
      if (j->generator == NULL) {
        std::string plugin_name = PluginName(plugin_prefix_, j->name);
        if (plugin_name == i->first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }
    if (!foundImplicitPlugin) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" + i->first.substr(plugin_prefix_.size() + 4) + "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // The --proto_path & --descriptor_set_in flags both specify places to look
  // for proto files. If neither were given, use the current working directory.
  if (proto_path_.empty() && descriptor_set_in_names_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<std::string, std::string>("", "."));
  }

  // Check error cases that span multiple flag values.
  bool missing_proto_definitions = false;
  switch (mode_) {
    case MODE_COMPILE:
      missing_proto_definitions = input_files_.empty();
      break;
    case MODE_DECODE:
      // Handle --decode_raw separately, since it requires that no proto
      // definitions are specified.
      if (codec_type_.empty()) {
        if (!input_files_.empty() || !descriptor_set_in_names_.empty()) {
          std::cerr
              << "When using --decode_raw, no input files should be given."
              << std::endl;
          return PARSE_ARGUMENT_FAIL;
        }
        missing_proto_definitions = false;
        break;  // only for --decode_raw
      }
      // --decode (not raw) is handled the same way as the rest of the modes.
      PROTOBUF_FALLTHROUGH_INTENDED;
    case MODE_ENCODE:
    case MODE_PRINT:
      missing_proto_definitions =
          input_files_.empty() && descriptor_set_in_names_.empty();
      break;
    default:
      GOOGLE_LOG(FATAL) << "Unexpected mode: " << mode_;
  }
  if (missing_proto_definitions) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_out_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_ENCODE && deterministic_output_) {
    std::cerr << "Can only use --deterministic_output with --encode."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}